

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InstructionFolder::FoldInstructionInternal(InstructionFolder *this,Instruction *inst)

{
  IRContext *this_00;
  _Any_data *p_Var1;
  _Any_data *p_Var2;
  void *pvVar3;
  bool bVar4;
  Instruction *this_01;
  FoldingRuleSet *pFVar5;
  uint uVar6;
  _Any_data *p_Var7;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  constants;
  undefined1 local_d0 [16];
  pointer local_c0;
  uint local_b8 [2];
  uint *local_b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_a8;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  Instruction *local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp:181:23)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<unsigned_int_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fold.cpp:181:23)>
             ::_M_manager;
  this_01 = FoldInstructionToConstant(this,inst,(function<unsigned_int_(unsigned_int)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (this_01 == (Instruction *)0x0) {
    this_00 = this->context_;
    if ((this_00->valid_analyses_ & kAnalysisConstants) == kAnalysisNone) {
      IRContext::BuildConstantManager(this_00);
    }
    analysis::ConstantManager::GetOperandConstants
              ((vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                *)local_d0,
               (this_00->constant_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::ConstantManager,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::ConstantManager_*,_std::default_delete<spvtools::opt::analysis::ConstantManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::ConstantManager_*,_false>.
               _M_head_impl,inst);
    pFVar5 = FoldingRules::GetRulesForInstruction
                       ((this->folding_rules_)._M_t.
                        super___uniq_ptr_impl<spvtools::opt::FoldingRules,_std::default_delete<spvtools::opt::FoldingRules>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::FoldingRules_*,_std::default_delete<spvtools::opt::FoldingRules>_>
                        .super__Head_base<0UL,_spvtools::opt::FoldingRules_*,_false>._M_head_impl,
                        inst);
    p_Var1 = (_Any_data *)
             (pFVar5->
             super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    p_Var2 = (_Any_data *)
             (pFVar5->
             super__Vector_base<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>,_std::allocator<std::function<bool_(spvtools::opt::IRContext_*,_spvtools::opt::Instruction_*,_const_std::vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>_&)>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var1 == p_Var2) {
      bVar4 = false;
    }
    else {
      do {
        p_Var7 = p_Var1 + 2;
        local_a0._0_8_ = this->context_;
        local_78 = inst;
        if (*(long *)(p_Var1 + 1) == 0) {
          std::__throw_bad_function_call();
        }
        bVar4 = (**(code **)(p_Var1->_M_pod_data + 0x18))
                          (p_Var1,(IRContext **)local_a0,&local_78,
                           (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
                            *)local_d0);
      } while ((!bVar4) && (p_Var1 = p_Var7, p_Var7 != p_Var2));
    }
    pvVar3 = (void *)CONCAT44(local_d0._4_4_,local_d0._0_4_);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,(long)local_c0 - (long)pvVar3);
    }
  }
  else {
    inst->opcode_ = OpCopyObject;
    local_a0[0x10] = '\0';
    local_a0[0x11] = '\0';
    local_a0[0x12] = '\0';
    local_a0[0x13] = '\0';
    if (this_01->has_result_id_ == true) {
      local_a0._16_4_ = Instruction::GetSingleWordOperand(this_01,(uint)this_01->has_type_id_);
    }
    local_a0._24_8_ = local_a0 + 0x10;
    local_a0._0_8_ = &PTR__SmallVector_00930a20;
    local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_a0._8_8_ = 1;
    local_d0._0_4_ = 1;
    local_d0._8_8_ = &PTR__SmallVector_00930a20;
    local_c0 = (pointer)0x0;
    local_b0 = local_b8;
    local_a8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)(local_d0 + 8),
               (SmallVector<unsigned_int,_2UL> *)local_a0);
    local_78 = (Instruction *)0x0;
    uStack_70 = 0;
    local_68 = 0;
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_initialize<spvtools::opt::Operand_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_78,
               local_d0,local_a0);
    uVar6 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar6 = (uint)inst->has_result_id_;
    }
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
              (&inst->operands_,
               (Operand *)
               ((long)((((inst->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                      0xfffffffffffffffa) + (ulong)(uVar6 * 0x30)),
               (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
               &inst->operands_,
               (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish,local_78,uStack_70);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_78)
    ;
    local_d0._8_8_ = &PTR__SmallVector_00930a20;
    if (local_a8 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_a8,local_a8);
    }
    local_a8 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
    local_a0._0_8_ = &PTR__SmallVector_00930a20;
    if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
        local_80._M_head_impl !=
        (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_80,local_80._M_head_impl);
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool InstructionFolder::FoldInstructionInternal(Instruction* inst) const {
  auto identity_map = [](uint32_t id) { return id; };
  Instruction* folded_inst = FoldInstructionToConstant(inst, identity_map);
  if (folded_inst != nullptr) {
    inst->SetOpcode(spv::Op::OpCopyObject);
    inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {folded_inst->result_id()}}});
    return true;
  }

  analysis::ConstantManager* const_manager = context_->get_constant_mgr();
  std::vector<const analysis::Constant*> constants =
      const_manager->GetOperandConstants(inst);

  for (const FoldingRule& rule :
       GetFoldingRules().GetRulesForInstruction(inst)) {
    if (rule(context_, inst, constants)) {
      return true;
    }
  }
  return false;
}